

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.h
# Opt level: O2

void __thiscall FIX::ThreadedSocketInitiator::lock(ThreadedSocketInitiator *this)

{
  Mutex::lock(&this->m_mutex);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void lock() { Locker l(m_mutex); }